

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Node<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo>::
emplaceValue<QRestAccessManagerPrivate::CallerInfo_const&>
          (Node<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo> *this,CallerInfo *args)

{
  Data *pDVar1;
  QObject *pQVar2;
  _Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false> _Var3;
  int *piVar4;
  
  pDVar1 = (args->contextObject).wp.d;
  pQVar2 = (args->contextObject).wp.value;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  _Var3._M_head_impl =
       (args->slot).obj._M_t.
       super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
       super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
       super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (QSlotObjectBase *)0x0) {
    LOCK();
    (_Var3._M_head_impl)->m_ref = (QAtomicInt)(*(int *)&(_Var3._M_head_impl)->m_ref + 1);
    UNLOCK();
  }
  _Var3._M_head_impl =
       (args->slot).obj._M_t.
       super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
       super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
       super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl;
  piVar4 = *(int **)(this + 8);
  *(Data **)(this + 8) = pDVar1;
  *(QObject **)(this + 0x10) = pQVar2;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      operator_delete(piVar4);
    }
  }
  piVar4 = *(int **)(this + 0x18);
  *(QSlotObjectBase **)(this + 0x18) = _Var3._M_head_impl;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      (**(code **)(piVar4 + 2))(0,piVar4,0,0,0);
      return;
    }
  }
  return;
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }